

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall kratos::FSM::output_table(FSM *this,string *filename)

{
  undefined1 local_230 [8];
  ofstream stream;
  string local_30;
  
  std::ofstream::ofstream(local_230,(string *)filename,_S_out);
  output_table_abi_cxx11_(&local_30,this);
  std::operator<<((ostream *)local_230,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::ofstream::close();
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

void FSM::output_table(const std::string& filename) {
    std::ofstream stream(filename);
    stream << output_table();
    stream.close();
}